

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* simplify_args_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char **ppcVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  size_type *psVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  string arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  value_type local_78;
  char **local_58;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < argc) {
    paVar1 = &local_98.field_2;
    iVar9 = 1;
    local_58 = argv;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,local_58[iVar9],(allocator<char> *)&local_98);
      iVar4 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar4 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_78);
        ppcVar3 = local_58;
        iVar5 = iVar9 + 1;
        iVar8 = iVar5;
        if (iVar5 < argc) {
          lVar10 = 0;
          do {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,ppcVar3[iVar5 + lVar10],(allocator<char> *)local_50);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != paVar1) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            lVar10 = lVar10 + 1;
            iVar8 = argc;
          } while ((argc + -1) - iVar9 != (int)lVar10);
        }
      }
      else {
        iVar8 = iVar9;
        if (((local_78._M_string_length < 3) || (*local_78._M_dataplus._M_p != '-')) ||
           (local_78._M_dataplus._M_p[1] == '-')) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_78);
        }
        else {
          uVar11 = 2;
          do {
            std::__cxx11::string::substr((ulong)local_50,(ulong)&local_78);
            plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1fac72);
            psVar7 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_98.field_2._M_allocated_capacity = *psVar7;
              local_98.field_2._8_8_ = plVar6[3];
              local_98._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_98.field_2._M_allocated_capacity = *psVar7;
              local_98._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_98._M_string_length = plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != paVar1) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            bVar2 = uVar11 < local_78._M_string_length;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (bVar2);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    } while ((iVar4 != 0) && (iVar9 = iVar8 + 1, iVar9 < argc));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> simplify_args(int argc, const char **argv)
{
    std::vector<std::string> r;
    for (int i = 1; i < argc; ++i) {
        std::string arg = argv[i];
        if (arg == "--") {
            // Add this arg and all remaining ones without simplification.
            r.push_back(arg);
            while ((++i) < argc)
                r.push_back(argv[i]);
            break;
        }
        // Check if it is of the form -abc and convert to -a -b -c
        if (arg.length() > 2 && arg[0] == '-' && arg[1] != '-') {
            for (unsigned j = 1; j < arg.length(); ++j) {
                r.push_back("-" + arg.substr(j, 1));
            }
        } else {
            r.push_back(arg);
        }
    }
    return r;
}